

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string extraFlags;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string linkRuleVar;
  string linkLanguage;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&linkRuleVar.field_2 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"CMAKE_",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::operator+=
            ((string *)local_58,(string *)(linkRuleVar.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_58,"_CREATE_MACOSX_FRAMEWORK");
  std::__cxx11::string::string((string *)local_90);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_90,
             (string *)((long)&linkRuleVar.field_2 + 8));
  this_00 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS",&local_b1);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)this_00,(string *)local_90,&local_b0,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  WriteLibraryRules(this,(string *)local_58,(string *)local_90,relink);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_MACOSX_FRAMEWORK";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->ConfigName);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}